

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1HighbdFwdTxfm2dTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_15c76d4::AV1HighbdFwdTxfm2dTest::AV1HighbdFwdTxfm2dTest
            ((AV1HighbdFwdTxfm2dTest *)this_00);
  (((TestWithParam<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_> *)
   &this_00->_vptr_Test)->super_Test)._vptr_Test = (_func_int **)&PTR__TestWithParam_00f3f7d8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1HighbdFwdTxfm2dTest_DISABLED_Speed_Test_00f3f818;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }